

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alffplay.cpp
# Opt level: O2

void __thiscall anon_unknown.dwarf_e668::AudioState::~AudioState(AudioState *this)

{
  deque<AVPacket,_std::allocator<AVPacket>_> *this_00;
  SwrContextDeleter *this_01;
  _Elt_pointer pAVar1;
  SwrContext *in_RSI;
  _Elt_pointer pAVar2;
  AVPacket *pkt;
  _Elt_pointer pAVar3;
  _Map_pointer ppAVar4;
  
  if (this->mSource != 0) {
    in_RSI = (SwrContext *)&this->mSource;
    alDeleteSources(1);
  }
  if ((this->mBuffers)._M_elems[0] != 0) {
    in_RSI = (SwrContext *)&this->mBuffers;
    alDeleteBuffers(0x28);
  }
  av_freep(&this->mSamples);
  std::condition_variable::~condition_variable(&this->mSrcCond);
  std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::~unique_ptr
            (&this->mBufferData);
  this_01 = (SwrContextDeleter *)
            (this->mSwresCtx)._M_t.
            super___uniq_ptr_impl<SwrContext,_(anonymous_namespace)::SwrContextDeleter>._M_t.
            super__Tuple_impl<0UL,_SwrContext_*,_(anonymous_namespace)::SwrContextDeleter>.
            super__Head_base<0UL,_SwrContext_*,_false>._M_head_impl;
  if (this_01 != (SwrContextDeleter *)0x0) {
    SwrContextDeleter::operator()(this_01,in_RSI);
  }
  (this->mSwresCtx)._M_t.super___uniq_ptr_impl<SwrContext,_(anonymous_namespace)::SwrContextDeleter>
  ._M_t.super__Tuple_impl<0UL,_SwrContext_*,_(anonymous_namespace)::SwrContextDeleter>.
  super__Head_base<0UL,_SwrContext_*,_false>._M_head_impl = (SwrContext *)0x0;
  std::unique_ptr<AVFrame,_(anonymous_namespace)::AVFrameDeleter>::~unique_ptr(&this->mDecodedFrame)
  ;
  pAVar3 = (this->mPackets).mPackets.super__Deque_base<AVPacket,_std::allocator<AVPacket>_>._M_impl.
           super__Deque_impl_data._M_start._M_cur;
  pAVar2 = (this->mPackets).mPackets.super__Deque_base<AVPacket,_std::allocator<AVPacket>_>._M_impl.
           super__Deque_impl_data._M_start._M_last;
  ppAVar4 = (this->mPackets).mPackets.super__Deque_base<AVPacket,_std::allocator<AVPacket>_>._M_impl
            .super__Deque_impl_data._M_start._M_node;
  pAVar1 = (this->mPackets).mPackets.super__Deque_base<AVPacket,_std::allocator<AVPacket>_>._M_impl.
           super__Deque_impl_data._M_finish._M_cur;
  while (pAVar3 != pAVar1) {
    av_packet_unref(pAVar3);
    pAVar3 = pAVar3 + 1;
    if (pAVar3 == pAVar2) {
      pAVar3 = ppAVar4[1];
      ppAVar4 = ppAVar4 + 1;
      pAVar2 = pAVar3 + 5;
    }
  }
  this_00 = &(this->mPackets).mPackets;
  std::deque<AVPacket,_std::allocator<AVPacket>_>::clear(this_00);
  (this->mPackets).mTotalSize = 0;
  std::_Deque_base<AVPacket,_std::allocator<AVPacket>_>::~_Deque_base
            (&this_00->super__Deque_base<AVPacket,_std::allocator<AVPacket>_>);
  std::condition_variable::~condition_variable(&(this->mPackets).mCondVar);
  std::unique_ptr<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter>::~unique_ptr
            (&this->mCodecCtx);
  return;
}

Assistant:

~AudioState()
    {
        if(mSource)
            alDeleteSources(1, &mSource);
        if(mBuffers[0])
            alDeleteBuffers(static_cast<ALsizei>(mBuffers.size()), mBuffers.data());

        av_freep(&mSamples);
    }